

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

_Bool duckdb_je_prof_thread_active_init_set(tsdn_t *tsdn,_Bool active_init)

{
  _Bool _Var1;
  
  malloc_mutex_lock(tsdn,&prof_thread_active_init_mtx);
  _Var1 = prof_thread_active_init;
  prof_thread_active_init_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  prof_thread_active_init = active_init;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&prof_thread_active_init_mtx.field_0 + 0x48));
  return _Var1;
}

Assistant:

bool
prof_thread_active_init_set(tsdn_t *tsdn, bool active_init) {
	bool active_init_old;

	malloc_mutex_lock(tsdn, &prof_thread_active_init_mtx);
	active_init_old = prof_thread_active_init;
	prof_thread_active_init = active_init;
	malloc_mutex_unlock(tsdn, &prof_thread_active_init_mtx);
	return active_init_old;
}